

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledMisc.cpp
# Opt level: O0

int Imf_2_5::levelSize(int min,int max,int l,LevelRoundingMode rmode)

{
  ArgExc *this;
  int *piVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  int size;
  int b;
  int a;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  
  if (in_EDX < 0) {
    this = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(this,"Argument not in valid range.");
    __cxa_throw(this,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  local_14 = (in_ESI - in_EDI) + 1;
  local_18 = 1 << ((byte)in_EDX & 0x1f);
  local_1c = local_14 / local_18;
  if ((in_ECX == 1) && (local_1c * local_18 < local_14)) {
    local_1c = local_1c + 1;
  }
  local_20 = 1;
  piVar1 = std::max<int>(&local_1c,&local_20);
  return *piVar1;
}

Assistant:

int
levelSize (int min, int max, int l, LevelRoundingMode rmode)
{
    if (l < 0)
	throw IEX_NAMESPACE::ArgExc ("Argument not in valid range.");

    int a = max - min + 1;
    int b = (1 << l);
    int size = a / b;

    if (rmode == ROUND_UP && size * b < a)
	size += 1;

    return std::max (size, 1);
}